

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
ghc::filesystem::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,path *p)

{
  char cVar1;
  size_type sVar2;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ps;
  
  std::operator<<(os,"\"");
  path::string<char,std::char_traits<char>,std::allocator<char>>(&ps,p,&local_51);
  for (sVar2 = 0; ps._M_string_length != sVar2; sVar2 = sVar2 + 1) {
    cVar1 = ps._M_dataplus._M_p[sVar2];
    if ((cVar1 == '\\') || (cVar1 == '\"')) {
      std::operator<<(os,'\\');
    }
    std::operator<<(os,cVar1);
  }
  std::operator<<(os,"\"");
  std::__cxx11::string::~string((string *)&ps);
  return os;
}

Assistant:

inline std::basic_ostream<charT, traits>& operator<<(std::basic_ostream<charT, traits>& os, const path& p)
{
    os << "\"";
    auto ps = p.string<charT, traits>();
    for (auto c : ps) {
        if (c == '"' || c == '\\') {
            os << '\\';
        }
        os << c;
    }
    os << "\"";
    return os;
}